

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

value_type __thiscall
jsoncons::jsonpath::detail::
length_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(length_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  json_type jVar2;
  size_t sVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar4;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  string_view_type sVar6;
  string_view_type sVar7;
  value_type vVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bStack_28;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != 0) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar4);
    uVar5 = extraout_RDX;
    goto LAB_00444548;
  }
  if (*pcVar1 == '\0') {
    pbVar4 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              (pcVar1 + 8);
  }
  else {
    pbVar4 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (pcVar1 + 8);
  }
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            (&bStack_28,pbVar4);
  jVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                    (&bStack_28);
  if (jVar2 - 8 < 2) {
    sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                      (&bStack_28);
LAB_00444518:
    *(undefined2 *)
     &(this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      )._vptr_function_base = 3;
    (this->
    super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = sVar3;
  }
  else {
    if (jVar2 == string_value) {
      sVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
              as_string_view(&bStack_28);
      sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
              as_string_view(&bStack_28);
      sVar3 = unicode_traits::count_codepoints<char>(sVar6._M_str,sVar7._M_len,strict);
      goto LAB_00444518;
    }
    std::error_code::operator=(in_RCX,invalid_type);
    pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar4);
  }
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy(&bStack_28);
  uVar5 = extraout_RDX_00;
LAB_00444548:
  vVar8.field_0.int64_.val_ = uVar5;
  vVar8.field_0._0_8_ = this;
  return (value_type)vVar8.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0 = args[0].value();
            //std::cout << "length function arg: " << arg0 << "\n";

            switch (arg0.type())
            {
                case json_type::object_value:
                case json_type::array_value:
                    //std::cout << "LENGTH ARG: " << arg0 << "\n";
                    return value_type(arg0.size(), semantic_tag::none);
                case json_type::string_value:
                {
                    auto sv0 = arg0.template as<string_view_type>();
                    auto length = unicode_traits::count_codepoints(sv0.data(), sv0.size());
                    return value_type(length, semantic_tag::none);
                }
                default:
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
            }
        }